

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

SockAddr * sk_namelookup(char *host,char **canonicalname,int address_family)

{
  sockaddr *psVar1;
  long lVar2;
  int __ecode;
  char *pcVar3;
  undefined4 local_70;
  int err;
  char *trimmed_host;
  addrinfo hints;
  SockAddr *addr;
  int address_family_local;
  char **canonicalname_local;
  char *host_local;
  
  *canonicalname = (char *)0x0;
  if (*host == '/') {
    pcVar3 = dupstr(host);
    *canonicalname = pcVar3;
    host_local = (char *)unix_sock_addr(host);
  }
  else {
    hints.ai_next = (addrinfo *)safemalloc(1,0x220,0);
    memset(hints.ai_next,0,0x220);
    (hints.ai_next)->ai_addrlen = 0;
    (hints.ai_next)->ai_flags = 1;
    memset(&trimmed_host,0,0x30);
    if (address_family == 1) {
      local_70 = 2;
    }
    else {
      local_70 = 0;
      if (address_family == 2) {
        local_70 = 10;
      }
    }
    trimmed_host._4_4_ = local_70;
    trimmed_host._0_4_ = 2;
    hints.ai_flags = 1;
    pcVar3 = host_strduptrim(host);
    __ecode = getaddrinfo(pcVar3,(char *)0x0,(addrinfo *)&trimmed_host,
                          (addrinfo **)&(hints.ai_next)->ai_addr);
    safefree(pcVar3);
    if ((hints.ai_next)->ai_addr == (sockaddr *)0x0) {
      pcVar3 = gai_strerror(__ecode);
      *(char **)&(hints.ai_next)->ai_socktype = pcVar3;
    }
    else {
      (hints.ai_next)->ai_addrlen = 2;
      psVar1 = (hints.ai_next)->ai_addr;
      lVar2._0_2_ = psVar1[2].sa_family;
      lVar2._2_1_ = psVar1[2].sa_data[0];
      lVar2._3_1_ = psVar1[2].sa_data[1];
      lVar2._4_1_ = psVar1[2].sa_data[2];
      lVar2._5_1_ = psVar1[2].sa_data[3];
      lVar2._6_1_ = psVar1[2].sa_data[4];
      lVar2._7_1_ = psVar1[2].sa_data[5];
      if (lVar2 == 0) {
        pcVar3 = dupstr(host);
        *canonicalname = pcVar3;
      }
      else {
        pcVar3 = dupstr(*(char **)((hints.ai_next)->ai_addr + 2));
        *canonicalname = pcVar3;
      }
    }
    host_local = (char *)hints.ai_next;
  }
  return (SockAddr *)host_local;
}

Assistant:

SockAddr *sk_namelookup(const char *host, char **canonicalname,
                        int address_family)
{
    *canonicalname = NULL;

    if (host[0] == '/') {
        *canonicalname = dupstr(host);
        return unix_sock_addr(host);
    }

    SockAddr *addr = snew(SockAddr);
    memset(addr, 0, sizeof(SockAddr));
    addr->superfamily = UNRESOLVED;
    addr->refcount = 1;

#ifndef NO_IPV6
    /*
     * Use getaddrinfo, as long as it's available. This should handle
     * both IPv4 and IPv6 address literals, and hostnames, in one
     * unified API.
     */
    {
        struct addrinfo hints;
        memset(&hints, 0, sizeof(hints));
        hints.ai_family = (address_family == ADDRTYPE_IPV4 ? AF_INET :
                           address_family == ADDRTYPE_IPV6 ? AF_INET6 :
                           AF_UNSPEC);
        hints.ai_flags = AI_CANONNAME;
        hints.ai_socktype = SOCK_STREAM;

        /* strip [] on IPv6 address literals */
        char *trimmed_host = host_strduptrim(host);
        int err = getaddrinfo(trimmed_host, NULL, &hints, &addr->ais);
        sfree(trimmed_host);

        if (addr->ais) {
            addr->superfamily = IP;
            if (addr->ais->ai_canonname)
                *canonicalname = dupstr(addr->ais->ai_canonname);
            else
                *canonicalname = dupstr(host);
        } else {
            addr->error = gai_strerror(err);
        }
        return addr;
    }

#else
    /*
     * Failing that (if IPv6 support was not compiled in), try the
     * old-fashioned approach, which is to start by manually checking
     * for an IPv4 literal and then use gethostbyname.
     */
    unsigned long a = inet_addr(host);
    if (a != (unsigned long) INADDR_NONE) {
        addr->addresses = snew(unsigned long);
        addr->naddresses = 1;
        addr->addresses[0] = ntohl(a);
        addr->superfamily = IP;
        *canonicalname = dupstr(host);
        return addr;
    }

    struct hostent *h = gethostbyname(host);
    if (h) {
        addr->superfamily = IP;

        size_t n;
        for (n = 0; h->h_addr_list[n]; n++);
        addr->addresses = snewn(n, unsigned long);
        addr->naddresses = n;
        for (n = 0; n < addr->naddresses; n++) {
            uint32_t a;
            memcpy(&a, h->h_addr_list[n], sizeof(a));
            addr->addresses[n] = ntohl(a);
        }

        *canonicalname = dupstr(h->h_name);
    } else {
        addr->error = hstrerror(h_errno);
    }
    return addr;
#endif
}